

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-varr.h
# Opt level: O0

void mir_varr_error(char *message)

{
  char *message_local;
  
  fprintf(_stderr,"%s\n",message);
  exit(1);
}

Assistant:

static inline void MIR_VARR_NO_RETURN mir_varr_error (const char *message) {
#ifdef MIR_VARR_ERROR
  MIR_VARR_ERROR (message);
  assert (0);
#else
  fprintf (stderr, "%s\n", message);
#endif
  exit (1);
}